

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fLightAmountTest.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::LightAmountTest::init(LightAmountTest *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"none","none");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"1dir","1dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)&DAT_00000001;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"2dir","2dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x2;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"4dir","4dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)&DAT_00000004;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"6dir","6dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x6;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"8dir","8dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x8;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"10dir","10dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0xa;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"12dir","12dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0xc;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"14dir","14dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0xe;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"16dir","16dir");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x10;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"1omni","1omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x100000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"2omni","2omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x200000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"4omni","4omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x400000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"6omni","6omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x600000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"8omni","8omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x800000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"10omni","10omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0xa00000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"12omni","12omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0xc00000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"14omni","14omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0xe00000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"16omni","16omni");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215efc0;
  pTVar2[1].m_testCtx = (TestContext *)0x1000000000;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void LightAmountTest::init (void)
{
	//										name				dir,	omni,	spot
	addChild(new LightAmountCase(m_context, "none",				0,		0,		0	));
	addChild(new LightAmountCase(m_context, "1dir",				1,		0,		0	));
	addChild(new LightAmountCase(m_context, "2dir",				2,		0,		0	));
	addChild(new LightAmountCase(m_context, "4dir",				4,		0,		0	));
	addChild(new LightAmountCase(m_context, "6dir",				6,		0,		0	));
	addChild(new LightAmountCase(m_context, "8dir",				8,		0,		0	));
	addChild(new LightAmountCase(m_context, "10dir",			10,		0,		0	));
	addChild(new LightAmountCase(m_context, "12dir",			12,		0,		0	));
	addChild(new LightAmountCase(m_context, "14dir",			14,		0,		0	));
	addChild(new LightAmountCase(m_context, "16dir",			16,		0,		0	));
	addChild(new LightAmountCase(m_context, "1omni",			0,		1,		0	));
	addChild(new LightAmountCase(m_context, "2omni",			0,		2,		0	));
	addChild(new LightAmountCase(m_context, "4omni",			0,		4,		0	));
	addChild(new LightAmountCase(m_context, "6omni",			0,		6,		0	));
	addChild(new LightAmountCase(m_context, "8omni",			0,		8,		0	));
	addChild(new LightAmountCase(m_context, "10omni",			0,		10,		0	));
	addChild(new LightAmountCase(m_context, "12omni",			0,		12,		0	));
	addChild(new LightAmountCase(m_context, "14omni",			0,		14,		0	));
	addChild(new LightAmountCase(m_context, "16omni",			0,		16,		0	));
//	addChild(new LightAmountCase(m_context, "1spot",			0,		0,		1	));
//	addChild(new LightAmountCase(m_context, "2spot",			0,		0,		2	));
//	addChild(new LightAmountCase(m_context, "4spot",			0,		0,		4	));
//	addChild(new LightAmountCase(m_context, "6spot",			0,		0,		6	));
//	addChild(new LightAmountCase(m_context, "8spot",			0,		0,		8	));
//	addChild(new LightAmountCase(m_context, "1dir_1omni",		1,		1,		0	));
//	addChild(new LightAmountCase(m_context, "2dir_2omni",		2,		2,		0	));
//	addChild(new LightAmountCase(m_context, "4dir_4omni",		4,		4,		0	));
//	addChild(new LightAmountCase(m_context, "1dir_1spot",		1,		0,		1	));
//	addChild(new LightAmountCase(m_context, "2dir_2spot",		2,		0,		2	));
//	addChild(new LightAmountCase(m_context, "4dir_4spot",		4,		0,		4	));
//	addChild(new LightAmountCase(m_context, "1omni_1spot",		0,		1,		1	));
//	addChild(new LightAmountCase(m_context, "2omni_2spot",		0,		2,		2	));
//	addChild(new LightAmountCase(m_context, "4omni_4spot",		0,		4,		4	));
//	addChild(new LightAmountCase(m_context, "1dir_1omni_1spot",	1,		1,		1	));
//	addChild(new LightAmountCase(m_context, "2dir_2omni_2spot",	2,		2,		2	));
//	addChild(new LightAmountCase(m_context, "4dir_2omni_2spot",	4,		2,		2	));
//	addChild(new LightAmountCase(m_context, "2dir_4omni_2spot",	2,		4,		2	));
//	addChild(new LightAmountCase(m_context, "2dir_2omni_4spot",	2,		2,		4	));
//	addChild(new LightAmountCase(m_context, "4dir_4omni_4spot",	4,		4,		4	));
}